

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O1

RuntimeID __thiscall Jinx::Variant::GetFunction(Variant *this)

{
  bool bVar1;
  double dVar2;
  Variant v;
  Variant local_30;
  
  if (this->m_type == Function) {
    dVar2 = (this->field_1).m_number;
  }
  else {
    Copy(&local_30,this);
    bVar1 = ConvertTo(&local_30,Function);
    if (bVar1) {
      dVar2 = (double)GetFunction(&local_30);
    }
    else {
      dVar2 = 0.0;
    }
    Destroy(&local_30);
  }
  return (RuntimeID)dVar2;
}

Assistant:

inline_t RuntimeID Variant::GetFunction() const
	{
		if (IsFunction())
			return m_function;
		Variant v = *this;
		if (!v.ConvertTo(ValueType::Function))
			return InvalidID;
		return v.GetFunction();
	}